

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_zip.c
# Opt level: O3

void test_compat_zip_7(void)

{
  wchar_t wVar1;
  int iVar2;
  char *buff;
  archive *a;
  size_t read_size;
  size_t s;
  archive_entry *ae;
  size_t local_40;
  archive_entry *local_38;
  
  extract_reference_file("test_compat_zip_7.xps");
  buff = slurpfile(&local_40,"test_compat_zip_7.xps");
  read_size = 1;
  do {
    a = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                     ,L'ƞ',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    wVar1 = archive_read_support_format_zip(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'Ɵ',0,"ARCHIVE_OK",(long)wVar1,"archive_read_support_format_zip(a)",a);
    iVar2 = read_open_memory_minimal(a,buff,local_40,read_size);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'Ơ',0,"ARCHIVE_OK",(long)iVar2,"read_open_memory_minimal(a, p, s, i)",a);
    iVar2 = archive_read_next_header(a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'Ƣ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",a);
    iVar2 = archive_read_data_skip(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'ƣ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_data_skip(a)",a);
    iVar2 = archive_read_next_header(a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'Ƥ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",a);
    iVar2 = archive_read_data_skip(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'ƥ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_data_skip(a)",a);
    iVar2 = archive_read_next_header(a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'Ʀ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",a);
    iVar2 = archive_read_data_skip(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'Ƨ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_data_skip(a)",a);
    iVar2 = archive_read_next_header(a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'ƨ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",a);
    iVar2 = archive_read_data_skip(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'Ʃ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_data_skip(a)",a);
    iVar2 = archive_read_free(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_compat_zip.c"
                        ,L'ƫ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",a);
    read_size = read_size + 1;
  } while (read_size != 1000);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_compat_zip_7)
{
	const char *refname = "test_compat_zip_7.xps";
	struct archive *a;
	struct archive_entry *ae;
	void *p;
	size_t s;
	int i;

	extract_reference_file(refname);
	p = slurpfile(&s, refname);

	for (i = 1; i < 1000; ++i) {
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
		assertEqualIntA(a, ARCHIVE_OK, read_open_memory_minimal(a, p, s, i));

		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));

		assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
	}
	free(p);
}